

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMem.c
# Opt level: O3

void Ivy_ManAddMemory(Ivy_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  undefined8 *puVar3;
  int iVar4;
  void *pvVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  Ivy_Obj_t *pIVar8;
  
  if (p->pListFree == (Ivy_Obj_t *)0x0) {
    pvVar5 = malloc(0x50080);
    pVVar2 = p->vChunks;
    uVar1 = pVVar2->nSize;
    if (uVar1 == pVVar2->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = 0x10;
      }
      else {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = pVVar2->pArray;
    }
    iVar4 = pVVar2->nSize;
    pVVar2->nSize = iVar4 + 1;
    ppvVar6[iVar4] = pvVar5;
    pIVar8 = (Ivy_Obj_t *)(((ulong)pvVar5 & 0xffffffffffffff80) + 0x80);
    pVVar2 = p->vPages;
    uVar1 = pVVar2->nSize;
    if (uVar1 == pVVar2->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = 0x10;
      }
      else {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = pVVar2->pArray;
    }
    iVar4 = pVVar2->nSize;
    pVVar2->nSize = iVar4 + 1;
    ppvVar6[iVar4] = pIVar8;
    p->pListFree = pIVar8;
    iVar4 = 0xfff;
    puVar3 = (undefined8 *)((long)pvVar5 + (0xd0 - (ulong)((uint)pvVar5 & 0x7f)));
    do {
      puVar7 = puVar3;
      puVar7[-10] = puVar7;
      iVar4 = iVar4 + -1;
      puVar3 = puVar7 + 10;
    } while (iVar4 != 0);
    *puVar7 = 0;
    return;
  }
  __assert_fail("p->pListFree == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMem.c"
                ,0x5f,"void Ivy_ManAddMemory(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManAddMemory( Ivy_Man_t * p )
{
    char * pMemory;
    int i, nBytes;
    int EntrySizeMax = 128;
    assert( sizeof(Ivy_Obj_t) <= EntrySizeMax );
    assert( p->pListFree == NULL );
//    assert( (Ivy_ManObjNum(p) & IVY_PAGE_MASK) == 0 );
    // allocate new memory page
    nBytes = sizeof(Ivy_Obj_t) * (1<<IVY_PAGE_SIZE) + EntrySizeMax;
    pMemory = ABC_ALLOC( char, nBytes );
    Vec_PtrPush( p->vChunks, pMemory );
    // align memory at the 32-byte boundary
    pMemory = pMemory + EntrySizeMax - (((int)(ABC_PTRUINT_T)pMemory) & (EntrySizeMax-1));
    // remember the manager in the first entry
    Vec_PtrPush( p->vPages, pMemory );
    // break the memory down into nodes
    p->pListFree = (Ivy_Obj_t *)pMemory;
    for ( i = 1; i <= IVY_PAGE_MASK; i++ )
    {
        *((char **)pMemory) = pMemory + sizeof(Ivy_Obj_t);
        pMemory += sizeof(Ivy_Obj_t);
    }
    *((char **)pMemory) = NULL;
}